

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_KeyCompareToAdapter_Test::TestBody
          (Btree_KeyCompareToAdapter_Test *this)

{
  Btree_KeyCompareToAdapter_Test *this_local;
  
  (anonymous_namespace)::
  AssertKeyCompareToAdapted<std::less<std::__cxx11::string>,std::__cxx11::string>();
  (anonymous_namespace)::
  AssertKeyCompareToAdapted<std::greater<std::__cxx11::string>,std::__cxx11::string>();
  (anonymous_namespace)::
  AssertKeyCompareToAdapted<std::less<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
            ();
  (anonymous_namespace)::
  AssertKeyCompareToAdapted<std::greater<std::basic_string_view<char,std::char_traits<char>>>,std::basic_string_view<char,std::char_traits<char>>>
            ();
  (anonymous_namespace)::AssertKeyCompareToNotAdapted<std::less<int>,int>();
  (anonymous_namespace)::AssertKeyCompareToNotAdapted<std::greater<int>,int>();
  return;
}

Assistant:

TEST(Btree, KeyCompareToAdapter) {
        AssertKeyCompareToAdapted<std::less<std::string>, std::string>();
        AssertKeyCompareToAdapted<std::greater<std::string>, std::string>();
#if PHMAP_HAVE_STD_STRING_VIEW
        AssertKeyCompareToAdapted<std::less<std::string_view>, std::string_view>();
        AssertKeyCompareToAdapted<std::greater<std::string_view>,
                                  std::string_view>();
#endif
        AssertKeyCompareToNotAdapted<std::less<int>, int>();
        AssertKeyCompareToNotAdapted<std::greater<int>, int>();
    }